

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O2

int xmlC14NPrintAttrs(void *data,void *user)

{
  int iVar1;
  xmlChar *input;
  xmlChar *str;
  
  if (data == (void *)0x0 || user == (void *)0x0) {
    xmlC14NErrParam((xmlC14NCtxPtr)user);
LAB_0015dc32:
    iVar1 = 0;
  }
  else {
    xmlOutputBufferWriteString(*(xmlOutputBufferPtr *)((long)user + 0x20)," ");
    if (*(long *)((long)data + 0x48) != 0) {
      iVar1 = xmlStrlen(*(xmlChar **)(*(long *)((long)data + 0x48) + 0x18));
      if (0 < iVar1) {
        xmlOutputBufferWriteString
                  (*(xmlOutputBufferPtr *)((long)user + 0x20),
                   *(char **)(*(long *)((long)data + 0x48) + 0x18));
        xmlOutputBufferWriteString(*(xmlOutputBufferPtr *)((long)user + 0x20),":");
      }
    }
    xmlOutputBufferWriteString
              (*(xmlOutputBufferPtr *)((long)user + 0x20),*(char **)((long)data + 0x10));
    xmlOutputBufferWriteString(*(xmlOutputBufferPtr *)((long)user + 0x20),"=\"");
    iVar1 = 1;
    input = xmlNodeListGetString(*user,*(xmlNode **)((long)data + 0x18),1);
    if (input != (xmlChar *)0x0) {
      str = xmlC11NNormalizeString(input,XMLC14N_NORMALIZE_ATTR);
      (*xmlFree)(input);
      if (str == (xmlChar *)0x0) {
        xmlC14NErrMemory((xmlC14NCtxPtr)user);
        goto LAB_0015dc32;
      }
      xmlOutputBufferWriteString(*(xmlOutputBufferPtr *)((long)user + 0x20),(char *)str);
      (*xmlFree)(str);
    }
    xmlOutputBufferWriteString(*(xmlOutputBufferPtr *)((long)user + 0x20),"\"");
  }
  return iVar1;
}

Assistant:

static int
xmlC14NPrintAttrs(const void *data, void *user)
{
    const xmlAttr *attr = data;
    xmlC14NCtxPtr ctx = (xmlC14NCtxPtr) user;
    xmlChar *value;
    xmlChar *buffer;

    if ((attr == NULL) || (ctx == NULL)) {
        xmlC14NErrParam(ctx);
        return (0);
    }

    xmlOutputBufferWriteString(ctx->buf, " ");
    if (attr->ns != NULL && xmlStrlen(attr->ns->prefix) > 0) {
        xmlOutputBufferWriteString(ctx->buf,
                                   (const char *) attr->ns->prefix);
        xmlOutputBufferWriteString(ctx->buf, ":");
    }
    xmlOutputBufferWriteString(ctx->buf, (const char *) attr->name);
    xmlOutputBufferWriteString(ctx->buf, "=\"");

    value = xmlNodeListGetString(ctx->doc, attr->children, 1);
    /* todo: should we log an error if value==NULL ? */
    if (value != NULL) {
        buffer = xmlC11NNormalizeAttr(value);
        xmlFree(value);
        if (buffer != NULL) {
            xmlOutputBufferWriteString(ctx->buf, (const char *) buffer);
            xmlFree(buffer);
        } else {
            xmlC14NErrMemory(ctx);
            return (0);
        }
    }
    xmlOutputBufferWriteString(ctx->buf, "\"");
    return (1);
}